

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O1

void __thiscall bloaty::anon_unknown_0::ElfFile::ElfFile(ElfFile *this,string_view data)

{
  Elf64_Ehdr *pEVar1;
  Elf64_Half *pEVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  Elf64_Off EVar12;
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  Elf64_Addr EVar17;
  Elf64_Off EVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  byte bVar21;
  ushort uVar22;
  Nonnull<char_*> pcVar23;
  int *piVar24;
  ulong uVar25;
  Arg *in_R8;
  bool bVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  string_view format;
  string_view format_00;
  string_view sVar30;
  string local_b0;
  undefined1 local_90 [16];
  char local_80 [24];
  Elf64_Xword local_68;
  uint local_60;
  string_view local_48;
  string_view local_38;
  
  piVar24 = (int *)data._M_str;
  uVar25 = data._M_len;
  (this->data_)._M_len = uVar25;
  (this->data_)._M_str = (char *)piVar24;
  (this->section_name_table_).contents_._M_len = 0;
  (this->section_name_table_).contents_._M_str = (char *)0x0;
  (this->section_name_table_).range_._M_len = 0;
  (this->section_name_table_).range_._M_str = (char *)0x0;
  (this->header_region_)._M_len = 0;
  (this->header_region_)._M_str = (char *)0x0;
  (this->section_headers_)._M_len = 0;
  (this->section_headers_)._M_str = (char *)0x0;
  (this->segment_headers_)._M_len = 0;
  (this->segment_headers_)._M_str = (char *)0x0;
  if (uVar25 < 0x10) {
    bVar26 = false;
  }
  else {
    bVar26 = *piVar24 == 0x464c457f;
    if (bVar26) {
      bVar3 = *(byte *)(piVar24 + 1);
      bVar21 = *(byte *)((long)piVar24 + 5);
      if (bVar3 == 1) {
        bVar26 = false;
      }
      else {
        if (bVar3 != 2) {
          pcVar23 = absl::numbers_internal::FastIntToBuffer((uint)bVar3,local_80);
          local_90._0_8_ = pcVar23 + -(long)local_80;
          format._M_str = local_90;
          format._M_len = (size_t)"unexpected ELF class: $0";
          local_90._8_8_ = local_80;
          absl::Substitute_abi_cxx11_(&local_b0,(absl *)0x18,format,in_R8);
          Throw(local_b0._M_dataplus._M_p,0x1d2);
        }
        bVar26 = true;
      }
      this->is_64bit_ = bVar26;
      if (bVar21 != 1) {
        if (bVar21 != 2) {
          pcVar23 = absl::numbers_internal::FastIntToBuffer((uint)bVar21,local_80);
          local_90._0_8_ = pcVar23 + -(long)local_80;
          format_00._M_str = local_90;
          format_00._M_len = (size_t)"unexpected ELF data: $0";
          local_90._8_8_ = local_80;
          absl::Substitute_abi_cxx11_(&local_b0,(absl *)0x17,format_00,in_R8);
          Throw(local_b0._M_dataplus._M_p,0x1dd);
        }
        bVar21 = false;
      }
      this->is_native_endian_ = (bool)bVar21;
      pEVar1 = &this->header_;
      if (this->is_64bit_ == true) {
        if (this->is_native_endian_ == true) {
          if (uVar25 < 0x40) {
LAB_00184017:
            Throw("region out-of-bounds",0x5d);
          }
          uVar14 = *(undefined8 *)piVar24;
          uVar15 = *(undefined8 *)(piVar24 + 2);
          uVar16 = *(undefined8 *)(piVar24 + 4);
          EVar17 = *(Elf64_Addr *)(piVar24 + 6);
          EVar12 = *(Elf64_Off *)(piVar24 + 8);
          EVar18 = *(Elf64_Off *)(piVar24 + 10);
          uVar19 = *(undefined8 *)(piVar24 + 0xc);
          uVar20 = *(undefined8 *)(piVar24 + 0xe);
          (this->header_).e_flags = (int)uVar19;
          (this->header_).e_ehsize = (short)((ulong)uVar19 >> 0x20);
          (this->header_).e_phentsize = (short)((ulong)uVar19 >> 0x30);
          (this->header_).e_phnum = (short)uVar20;
          (this->header_).e_shentsize = (short)((ulong)uVar20 >> 0x10);
          (this->header_).e_shnum = (short)((ulong)uVar20 >> 0x20);
          (this->header_).e_shstrndx = (short)((ulong)uVar20 >> 0x30);
          (this->header_).e_phoff = EVar12;
          (this->header_).e_shoff = EVar18;
          (this->header_).e_type = (short)uVar16;
          (this->header_).e_machine = (short)((ulong)uVar16 >> 0x10);
          (this->header_).e_version = (int)((ulong)uVar16 >> 0x20);
          (this->header_).e_entry = EVar17;
          *(undefined8 *)pEVar1->e_ident = uVar14;
          *(undefined8 *)((this->header_).e_ident + 8) = uVar15;
        }
        else {
          if (uVar25 < 0x40) goto LAB_00184017;
          uVar14 = *(undefined8 *)piVar24;
          uVar15 = *(undefined8 *)(piVar24 + 2);
          uVar16 = *(undefined8 *)(piVar24 + 4);
          EVar17 = *(Elf64_Addr *)(piVar24 + 6);
          EVar12 = *(Elf64_Off *)(piVar24 + 8);
          EVar18 = *(Elf64_Off *)(piVar24 + 10);
          uVar19 = *(undefined8 *)(piVar24 + 0xc);
          uVar20 = *(undefined8 *)(piVar24 + 0xe);
          (this->header_).e_flags = (int)uVar19;
          (this->header_).e_ehsize = (short)((ulong)uVar19 >> 0x20);
          (this->header_).e_phentsize = (short)((ulong)uVar19 >> 0x30);
          (this->header_).e_phnum = (short)uVar20;
          (this->header_).e_shentsize = (short)((ulong)uVar20 >> 0x10);
          (this->header_).e_shnum = (short)((ulong)uVar20 >> 0x20);
          (this->header_).e_shstrndx = (short)((ulong)uVar20 >> 0x30);
          (this->header_).e_phoff = EVar12;
          (this->header_).e_shoff = EVar18;
          (this->header_).e_type = (short)uVar16;
          (this->header_).e_machine = (short)((ulong)uVar16 >> 0x10);
          (this->header_).e_version = (int)((ulong)uVar16 >> 0x20);
          (this->header_).e_entry = EVar17;
          *(undefined8 *)pEVar1->e_ident = uVar14;
          *(undefined8 *)((this->header_).e_ident + 8) = uVar15;
          pEVar2 = &(this->header_).e_type;
          *pEVar2 = *pEVar2 << 8 | *pEVar2 >> 8;
          pEVar2 = &(this->header_).e_machine;
          *pEVar2 = *pEVar2 << 8 | *pEVar2 >> 8;
          uVar11 = (this->header_).e_version;
          (this->header_).e_version =
               uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
          uVar27 = (this->header_).e_entry;
          (this->header_).e_entry =
               uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
               (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
               (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 | (uVar27 & 0xff00) << 0x28
               | uVar27 << 0x38;
          uVar27 = (this->header_).e_phoff;
          (this->header_).e_phoff =
               uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
               (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
               (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 | (uVar27 & 0xff00) << 0x28
               | uVar27 << 0x38;
          uVar27 = (this->header_).e_shoff;
          (this->header_).e_shoff =
               uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
               (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
               (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 | (uVar27 & 0xff00) << 0x28
               | uVar27 << 0x38;
          uVar11 = (this->header_).e_flags;
          (this->header_).e_flags =
               uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
          uVar27._0_2_ = (this->header_).e_ehsize;
          uVar27._2_2_ = (this->header_).e_phentsize;
          uVar27._4_2_ = (this->header_).e_phnum;
          uVar27._6_2_ = (this->header_).e_shentsize;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = uVar27;
          auVar29 = psllw(auVar28,8);
          uVar27 = auVar29._0_8_ |
                   CONCAT26((ushort)uVar27._6_2_ >> 8,
                            CONCAT24((ushort)uVar27._4_2_ >> 8,
                                     CONCAT22((ushort)uVar27._2_2_ >> 8,
                                              (ushort)(undefined2)uVar27 >> 8)));
          (this->header_).e_ehsize = (short)uVar27;
          (this->header_).e_phentsize = (short)(uVar27 >> 0x10);
          (this->header_).e_phnum = (short)(uVar27 >> 0x20);
          (this->header_).e_shentsize = (short)(uVar27 >> 0x30);
          pEVar2 = &(this->header_).e_shnum;
          *pEVar2 = *pEVar2 << 8 | *pEVar2 >> 8;
          pEVar2 = &(this->header_).e_shstrndx;
          *pEVar2 = *pEVar2 << 8 | *pEVar2 >> 8;
        }
      }
      else {
        if (uVar25 < 0x34) goto LAB_00184017;
        uVar6 = *(ushort *)(piVar24 + 4);
        uVar4 = *(ushort *)((long)piVar24 + 0x12);
        uVar11 = piVar24[5];
        uVar7 = piVar24[6];
        uVar8 = piVar24[7];
        uVar9 = piVar24[8];
        uVar10 = piVar24[9];
        uVar27 = *(ulong *)(piVar24 + 10);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = uVar27;
        uVar5 = *(ushort *)(piVar24 + 0xc);
        uVar22 = *(ushort *)((long)piVar24 + 0x32);
        bVar26 = this->is_native_endian_;
        uVar14 = *(undefined8 *)(piVar24 + 2);
        *(undefined8 *)pEVar1->e_ident = *(undefined8 *)piVar24;
        *(undefined8 *)((this->header_).e_ident + 8) = uVar14;
        if (bVar26 == true) {
          (this->header_).e_type = uVar6;
          (this->header_).e_machine = uVar4;
          (this->header_).e_version = uVar11;
          (this->header_).e_entry = (ulong)uVar7;
          (this->header_).e_phoff = (ulong)uVar8;
          (this->header_).e_shoff = (ulong)uVar9;
          (this->header_).e_flags = uVar10;
          (this->header_).e_ehsize = (short)uVar27;
          (this->header_).e_phentsize = (short)(uVar27 >> 0x10);
          (this->header_).e_phnum = (short)(uVar27 >> 0x20);
          (this->header_).e_shentsize = (short)(uVar27 >> 0x30);
          (this->header_).e_shnum = uVar5;
        }
        else {
          (this->header_).e_type = uVar6 << 8 | uVar6 >> 8;
          (this->header_).e_machine = uVar4 << 8 | uVar4 >> 8;
          (this->header_).e_version =
               uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
          (this->header_).e_entry =
               (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                      uVar7 << 0x18);
          (this->header_).e_phoff =
               (ulong)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                      uVar8 << 0x18);
          (this->header_).e_shoff =
               (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                      uVar9 << 0x18);
          (this->header_).e_flags =
               uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
          auVar29 = psllw(auVar29,8);
          uVar27 = auVar29._0_8_ |
                   CONCAT26((ushort)(uVar27 >> 0x38),
                            CONCAT24((ushort)(uVar27 >> 0x20) >> 8,
                                     CONCAT22((ushort)(uVar27 >> 0x10) >> 8,(ushort)uVar27 >> 8)));
          (this->header_).e_ehsize = (short)uVar27;
          (this->header_).e_phentsize = (short)(uVar27 >> 0x10);
          (this->header_).e_phnum = (short)(uVar27 >> 0x20);
          (this->header_).e_shentsize = (short)(uVar27 >> 0x30);
          (this->header_).e_shnum = uVar5 << 8 | uVar5 >> 8;
          uVar22 = uVar22 << 8 | uVar22 >> 8;
        }
        (this->header_).e_shstrndx = uVar22;
      }
      local_38._M_len = 0;
      local_38._M_str = (char *)0x0;
      local_48._M_len = 0;
      local_48._M_str = (char *)0x0;
      EVar12 = (this->header_).e_shoff;
      bVar3 = 1;
      if ((EVar12 != 0) && (EVar12 + (this->header_).e_shentsize < uVar25)) {
        this->section_count_ = 1;
        bVar3 = 0;
        ReadSection(this,0,(Section *)local_90);
      }
      uVar25 = (ulong)(this->header_).e_shnum;
      this->section_count_ = uVar25;
      uVar6 = (this->header_).e_shstrndx;
      this->section_string_index_ = (ulong)uVar6;
      if (!(bool)(uVar25 != 0 | bVar3)) {
        this->section_count_ = local_68;
      }
      if (!(bool)(bVar3 | uVar6 != 0xffff)) {
        this->section_string_index_ = (ulong)local_60;
      }
      sVar30 = GetRegion(this,0,(ulong)(this->header_).e_ehsize);
      this->header_region_ = sVar30;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = this->section_count_;
      auVar13 = ZEXT216((this->header_).e_shentsize) * auVar13;
      if (auVar13._8_8_ != 0) {
        Throw("integer overflow in multiply",0x54);
      }
      sVar30 = GetRegion(this,(this->header_).e_shoff,auVar13._0_8_);
      this->section_headers_ = sVar30;
      sVar30 = GetRegion(this,(this->header_).e_phoff,
                         (ulong)(this->header_).e_phentsize * (ulong)(this->header_).e_phnum);
      this->segment_headers_ = sVar30;
      if (this->section_count_ != 0) {
        ReadSection(this,(Elf64_Word)this->section_string_index_,&this->section_name_table_);
        if ((this->section_name_table_).header_.sh_type != 3) {
          Throw("section string index pointed to non-strtab",0x204);
        }
      }
      bVar26 = true;
    }
  }
  this->ok_ = bVar26;
  return;
}

Assistant:

ElfFile(string_view data) : data_(data) {
    ok_ = Initialize();
  }